

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3JoinType(Parse *pParse,Token *pA,Token *pB,Token *pC)

{
  uint N;
  Token *pTVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  Token *apAll [3];
  
  apAll[0] = pA;
  apAll[1] = pB;
  apAll[2] = pC;
  uVar5 = 0;
  for (lVar3 = 0; (lVar4 = 2, lVar3 != 3 && (pTVar1 = apAll[lVar3], pTVar1 != (Token *)0x0));
      lVar3 = lVar3 + 1) {
    N = pTVar1->n;
    while( true ) {
      if (lVar4 == 0x17) {
        uVar5 = uVar5 | 0x40;
        goto LAB_0014895c;
      }
      if ((N == (byte)(&UNK_0016c0cf)[lVar4]) &&
         (iVar2 = sqlite3_strnicmp(pTVar1->z,
                                   "naturaleftouterightfullinnercross" +
                                   (byte)(&UNK_0016c0ce)[lVar4],N), iVar2 == 0)) break;
      lVar4 = lVar4 + 3;
    }
    uVar5 = uVar5 | (&sqlite3JoinType::aKeyword[0].i)[lVar4];
  }
LAB_0014895c:
  if ((~uVar5 & 0x21) == 0 || (uVar5 & 0x40) != 0) {
    pcVar6 = " ";
    if (pC == (Token *)0x0) {
      pcVar6 = "";
    }
    sqlite3ErrorMsg(pParse,"unknown or unsupported join type: %T %T%s%T",pA,pB,pcVar6);
  }
  else {
    if ((uVar5 & 0x18) == 8 || (uVar5 & 0x20) == 0) {
      return uVar5;
    }
    sqlite3ErrorMsg(pParse,"RIGHT and FULL OUTER JOINs are not currently supported");
  }
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3JoinType(Parse *pParse, Token *pA, Token *pB, Token *pC){
  int jointype = 0;
  Token *apAll[3];
  Token *p;
                             /*   0123456789 123456789 123456789 123 */
  static const char zKeyText[] = "naturaleftouterightfullinnercross";
  static const struct {
    u8 i;        /* Beginning of keyword text in zKeyText[] */
    u8 nChar;    /* Length of the keyword in characters */
    u8 code;     /* Join type mask */
  } aKeyword[] = {
    /* natural */ { 0,  7, JT_NATURAL                },
    /* left    */ { 6,  4, JT_LEFT|JT_OUTER          },
    /* outer   */ { 10, 5, JT_OUTER                  },
    /* right   */ { 14, 5, JT_RIGHT|JT_OUTER         },
    /* full    */ { 19, 4, JT_LEFT|JT_RIGHT|JT_OUTER },
    /* inner   */ { 23, 5, JT_INNER                  },
    /* cross   */ { 28, 5, JT_INNER|JT_CROSS         },
  };
  int i, j;
  apAll[0] = pA;
  apAll[1] = pB;
  apAll[2] = pC;
  for(i=0; i<3 && apAll[i]; i++){
    p = apAll[i];
    for(j=0; j<ArraySize(aKeyword); j++){
      if( p->n==aKeyword[j].nChar 
          && sqlite3StrNICmp((char*)p->z, &zKeyText[aKeyword[j].i], p->n)==0 ){
        jointype |= aKeyword[j].code;
        break;
      }
    }
    testcase( j==0 || j==1 || j==2 || j==3 || j==4 || j==5 || j==6 );
    if( j>=ArraySize(aKeyword) ){
      jointype |= JT_ERROR;
      break;
    }
  }
  if(
     (jointype & (JT_INNER|JT_OUTER))==(JT_INNER|JT_OUTER) ||
     (jointype & JT_ERROR)!=0
  ){
    const char *zSp = " ";
    assert( pB!=0 );
    if( pC==0 ){ zSp++; }
    sqlite3ErrorMsg(pParse, "unknown or unsupported join type: "
       "%T %T%s%T", pA, pB, zSp, pC);
    jointype = JT_INNER;
  }else if( (jointype & JT_OUTER)!=0 
         && (jointype & (JT_LEFT|JT_RIGHT))!=JT_LEFT ){
    sqlite3ErrorMsg(pParse, 
      "RIGHT and FULL OUTER JOINs are not currently supported");
    jointype = JT_INNER;
  }
  return jointype;
}